

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

bool __thiscall Omega_h::InputScalar::as(InputScalar *this,double *out)

{
  uint *puVar1;
  uint uVar2;
  istringstream ss;
  long local_190 [3];
  uint auStack_178 [24];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)&this->str,_S_in);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 & 0xffffefff;
  std::istream::_M_extract<double>((double *)local_190);
  uVar2 = *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18) + 8);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
  std::ios_base::~ios_base(local_118);
  return (uVar2 & 7) == 2;
}

Assistant:

bool InputScalar::as(double& out) const {
  std::istringstream ss(str);
  ss >> std::noskipws >> out;
  return ss.eof() && !ss.fail();
}